

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_gpu_texture.cpp
# Opt level: O0

bool basisu::unpack_bc7_mode1_3_7(uint32_t mode,void *pBlock_bits,color_rgba *pPixels)

{
  anon_union_4_2_6eba8969_for_color_rgba_0 *paVar1;
  uint8_t uVar2;
  uint32_t uVar3;
  uint8_t *puVar4;
  byte *pbVar5;
  uint uVar6;
  long in_RDX;
  int in_EDI;
  uint32_t i_2;
  uint32_t c_2;
  uint32_t i_1;
  uint32_t s;
  color_rgba block_colors [2] [8];
  uint32_t c_1;
  uint32_t e_1;
  uint32_t i;
  uint32_t weights [16];
  uint32_t p;
  uint32_t pbits [4];
  uint32_t e;
  uint32_t c;
  color_rgba endpoints [4];
  uint32_t part;
  uint8_t *pBuf;
  uint32_t bit_offset;
  uint32_t WEIGHT_VALS;
  uint32_t SHARED_PBITS;
  uint32_t PBITS;
  uint32_t ENDPOINT_BITS;
  uint32_t WEIGHT_BITS;
  uint32_t COMPS;
  uint32_t ENDPOINTS;
  uint in_stack_fffffffffffffe6c;
  uint in_stack_fffffffffffffe70;
  uint32_t in_stack_fffffffffffffe74;
  uint32_t *in_stack_fffffffffffffe78;
  uint8_t *in_stack_fffffffffffffe80;
  anon_union_4_2_6eba8969_for_color_rgba_0 *paVar7;
  anon_union_4_2_6eba8969_for_color_rgba_0 *local_178;
  uint8_t local_160;
  color_rgba *local_138;
  undefined4 local_12c;
  uint local_128;
  uint local_124;
  uint local_120;
  uint local_11c;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_118 [16];
  anon_union_4_2_6eba8969_for_color_rgba_0 aStack_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint32_t auStack_c8 [19];
  uint local_7c;
  uint32_t auStack_78 [6];
  uint local_60;
  uint local_5c;
  color_rgba local_58 [4];
  color_rgba cStack_48;
  uint32_t local_44;
  int local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  undefined4 local_28;
  undefined4 local_24;
  uint local_20;
  undefined4 local_1c;
  long local_18;
  int local_8;
  bool local_1;
  
  local_1c = 4;
  local_20 = 3;
  if (in_EDI == 7) {
    local_20 = 4;
  }
  local_24 = 2;
  if (in_EDI == 1) {
    local_24 = 3;
  }
  if (in_EDI == 7) {
    local_12c = 5;
  }
  else {
    local_12c = 7;
    if (in_EDI == 1) {
      local_12c = 6;
    }
  }
  local_28 = local_12c;
  local_2c = (in_EDI != 1) + 2 + (uint)(in_EDI != 1);
  local_30 = (uint)(-(in_EDI == 1) & 1);
  local_34 = 1 << (sbyte)local_24;
  local_38 = 0;
  local_18 = in_RDX;
  local_8 = in_EDI;
  uVar3 = read_bits32(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe74)
  ;
  if (uVar3 == 1 << ((byte)local_8 & 0x1f)) {
    local_44 = read_bits32(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                           in_stack_fffffffffffffe74);
    local_138 = local_58;
    do {
      color_rgba::color_rgba(local_138);
      local_138 = local_138 + 1;
    } while (local_138 != &cStack_48);
    for (local_5c = 0; local_5c < local_20; local_5c = local_5c + 1) {
      for (local_60 = 0; local_60 < 4; local_60 = local_60 + 1) {
        uVar3 = read_bits32(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                            in_stack_fffffffffffffe74);
        puVar4 = color_rgba::operator[]
                           ((color_rgba *)
                            CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                            in_stack_fffffffffffffe6c);
        *puVar4 = (uint8_t)uVar3;
      }
    }
    for (local_7c = 0; local_7c < local_2c; local_7c = local_7c + 1) {
      uVar3 = read_bits32(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                          in_stack_fffffffffffffe74);
      auStack_78[local_7c] = uVar3;
    }
    for (local_cc = 0; local_cc < 0x10; local_cc = local_cc + 1) {
      uVar3 = read_bits32(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                          in_stack_fffffffffffffe74);
      auStack_c8[local_cc] = uVar3;
    }
    if (local_38 != 0x80) {
      __assert_fail("bit_offset == 128",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_gpu_texture.cpp"
                    ,0x216,"bool basisu::unpack_bc7_mode1_3_7(uint32_t, const void *, color_rgba *)"
                   );
    }
    for (local_d0 = 0; local_d0 < 4; local_d0 = local_d0 + 1) {
      for (local_d4 = 0; local_d4 < 4; local_d4 = local_d4 + 1) {
        uVar6 = 3;
        if (local_8 == 7) {
          uVar6 = 4;
        }
        if (local_d4 == uVar6) {
          local_160 = 0xff;
        }
        else {
          color_rgba::operator[]
                    ((color_rgba *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                     in_stack_fffffffffffffe6c);
          uVar3 = bc7_dequant(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70,
                              in_stack_fffffffffffffe6c);
          local_160 = (uint8_t)uVar3;
        }
        puVar4 = color_rgba::operator[]
                           ((color_rgba *)
                            CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                            in_stack_fffffffffffffe6c);
        *puVar4 = local_160;
      }
    }
    paVar7 = &aStack_d8;
    paVar1 = local_118;
    do {
      local_178 = paVar1;
      color_rgba::color_rgba((color_rgba *)&local_178->field_1);
      paVar1 = local_178 + 1;
    } while (local_178 + 1 != paVar7);
    for (local_11c = 0; local_11c < 2; local_11c = local_11c + 1) {
      for (local_120 = 0; local_120 < local_34; local_120 = local_120 + 1) {
        for (local_124 = 0; local_124 < local_20; local_124 = local_124 + 1) {
          pbVar5 = color_rgba::operator[]
                             ((color_rgba *)
                              CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                              in_stack_fffffffffffffe6c);
          in_stack_fffffffffffffe70 = (uint)*pbVar5;
          color_rgba::operator[]
                    ((color_rgba *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                     in_stack_fffffffffffffe6c);
          uVar3 = bc7_interp((uint32_t)paVar7,(uint32_t)((ulong)local_178 >> 0x20),
                             (uint32_t)local_178,in_stack_fffffffffffffe74);
          in_stack_fffffffffffffe74 = CONCAT13((char)uVar3,(int3)in_stack_fffffffffffffe74);
          puVar4 = color_rgba::operator[]
                             ((color_rgba *)
                              CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                              in_stack_fffffffffffffe6c);
          *puVar4 = (uint8_t)(in_stack_fffffffffffffe74 >> 0x18);
        }
        if (local_20 == 3) {
          in_stack_fffffffffffffe6c = 0xff;
        }
        else {
          pbVar5 = color_rgba::operator[]
                             ((color_rgba *)
                              CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                              in_stack_fffffffffffffe6c);
          in_stack_fffffffffffffe6c = (uint)*pbVar5;
        }
        uVar2 = (uint8_t)in_stack_fffffffffffffe6c;
        puVar4 = color_rgba::operator[]
                           ((color_rgba *)
                            CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                            in_stack_fffffffffffffe6c);
        *puVar4 = uVar2;
      }
    }
    for (local_128 = 0; local_128 < 0x10; local_128 = local_128 + 1) {
      *(anon_union_4_2_6eba8969_for_color_rgba_0 *)(local_18 + (ulong)local_128 * 4) =
           local_118[(ulong)(byte)basist::g_bc7_partition2[local_44 * 0x10 + local_128] * 8 +
                     (ulong)auStack_c8[local_128]];
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool unpack_bc7_mode1_3_7(uint32_t mode, const void* pBlock_bits, color_rgba* pPixels)
	{
		//const uint32_t SUBSETS = 2;
		const uint32_t ENDPOINTS = 4;
		const uint32_t COMPS = (mode == 7) ? 4 : 3;
		const uint32_t WEIGHT_BITS = (mode == 1) ? 3 : 2;
		const uint32_t ENDPOINT_BITS = (mode == 7) ? 5 : ((mode == 1) ? 6 : 7);
		const uint32_t PBITS = (mode == 1) ? 2 : 4;
		const uint32_t SHARED_PBITS = (mode == 1) ? true : false;
		const uint32_t WEIGHT_VALS = 1 << WEIGHT_BITS;
		
		uint32_t bit_offset = 0;
		const uint8_t* pBuf = static_cast<const uint8_t*>(pBlock_bits);

		if (read_bits32(pBuf, bit_offset, mode + 1) != (1U << mode)) return false;

		const uint32_t part = read_bits32(pBuf, bit_offset, 6);

		color_rgba endpoints[ENDPOINTS];
		for (uint32_t c = 0; c < COMPS; c++)
			for (uint32_t e = 0; e < ENDPOINTS; e++)
				endpoints[e][c] = (uint8_t)read_bits32(pBuf, bit_offset, ENDPOINT_BITS);
		
		uint32_t pbits[4];
		for (uint32_t p = 0; p < PBITS; p++)
			pbits[p] = read_bits32(pBuf, bit_offset, 1);
						
		uint32_t weights[16];
		for (uint32_t i = 0; i < 16; i++)
			weights[i] = read_bits32(pBuf, bit_offset, ((!i) || (i == basist::g_bc7_table_anchor_index_second_subset[part])) ? (WEIGHT_BITS - 1) : WEIGHT_BITS);
		
		assert(bit_offset == 128);

		for (uint32_t e = 0; e < ENDPOINTS; e++)
			for (uint32_t c = 0; c < 4; c++)
				endpoints[e][c] = (uint8_t)((c == ((mode == 7U) ? 4U : 3U)) ? 255 : bc7_dequant(endpoints[e][c], pbits[SHARED_PBITS ? (e >> 1) : e], ENDPOINT_BITS));
		
		color_rgba block_colors[2][8];
		for (uint32_t s = 0; s < 2; s++)
			for (uint32_t i = 0; i < WEIGHT_VALS; i++)
			{
				for (uint32_t c = 0; c < COMPS; c++)
					block_colors[s][i][c] = (uint8_t)bc7_interp(endpoints[s * 2 + 0][c], endpoints[s * 2 + 1][c], i, WEIGHT_BITS);
				block_colors[s][i][3] = (COMPS == 3) ? 255 : block_colors[s][i][3];
			}

		for (uint32_t i = 0; i < 16; i++)
			pPixels[i] = block_colors[basist::g_bc7_partition2[part * 16 + i]][weights[i]];

		return true;
	}